

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextdocument.cpp
# Opt level: O2

void __thiscall QTextHtmlExporter::emitTable(QTextHtmlExporter *this,QTextTable *table)

{
  QTextCharFormat *rhs;
  long lVar1;
  qreal qVar2;
  bool bVar3;
  Alignment align;
  int iVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  VerticalAlignment alignment;
  BorderStyle BVar8;
  ulong uVar9;
  char cVar10;
  int col;
  ulong uVar11;
  long in_FS_OFFSET;
  QTextLength QVar12;
  long local_278;
  undefined1 local_260 [8];
  QArrayDataPointer<char16_t> local_258;
  QStringBuilder<QLatin1String,_QString> local_240;
  QArrayDataPointer<char16_t> local_218;
  QArrayDataPointer<QTextLength> local_1f8;
  undefined1 local_1d8 [16];
  QArrayDataPointer<char16_t> local_1c8;
  qsizetype local_1b0;
  char *local_1a8;
  undefined1 local_198 [16];
  undefined1 local_188 [16];
  undefined1 local_178 [16];
  undefined1 local_168 [24];
  QVarLengthArray<bool,_256LL> widthEmittedForColumn;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_168._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_168._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QTextTable::format((QTextTable *)local_168);
  QString::append((QLatin1String *)this);
  bVar3 = QTextFormat::hasProperty((QTextFormat *)local_168,0x4000);
  if (bVar3) {
    qVar2 = QTextFrameFormat::border((QTextFrameFormat *)local_168);
    QString::number(qVar2,(char)&widthEmittedForColumn,0x67);
    emitAttribute(this,"border",(QString *)&widthEmittedForColumn);
    QArrayDataPointer<char16_t>::~QArrayDataPointer
              ((QArrayDataPointer<char16_t> *)&widthEmittedForColumn);
  }
  emitFrameStyle(this,(QTextFrameFormat *)local_168,TableFrame);
  align = QTextTableFormat::alignment((QTextTableFormat *)local_168);
  emitAlignment(this,align);
  QVar12 = QTextFrameFormat::width((QTextFrameFormat *)local_168);
  widthEmittedForColumn.super_QVLABase<bool>.super_QVLABaseBase.a._0_4_ = QVar12.lengthType;
  widthEmittedForColumn.super_QVLABase<bool>.super_QVLABaseBase.s =
       (qsizetype)QVar12.fixedValueOrPercentage;
  emitTextLength(this,"width",(QTextLength *)&widthEmittedForColumn);
  bVar3 = QTextFormat::hasProperty((QTextFormat *)local_168,0x4102);
  if (bVar3) {
    qVar2 = QTextTableFormat::cellSpacing((QTextTableFormat *)local_168);
    QString::number(qVar2,(char)&widthEmittedForColumn,0x67);
    emitAttribute(this,"cellspacing",(QString *)&widthEmittedForColumn);
    QArrayDataPointer<char16_t>::~QArrayDataPointer
              ((QArrayDataPointer<char16_t> *)&widthEmittedForColumn);
  }
  bVar3 = QTextFormat::hasProperty((QTextFormat *)local_168,0x4103);
  if (bVar3) {
    qVar2 = QTextTableFormat::cellPadding((QTextTableFormat *)local_168);
    QString::number(qVar2,(char)&widthEmittedForColumn,0x67);
    emitAttribute(this,"cellpadding",(QString *)&widthEmittedForColumn);
    QArrayDataPointer<char16_t>::~QArrayDataPointer
              ((QArrayDataPointer<char16_t> *)&widthEmittedForColumn);
  }
  emitBackgroundAttribute(this,(QTextFormat *)local_168);
  QString::append((QChar)(char16_t)this);
  iVar4 = QTextTable::rows(table);
  uVar5 = QTextTable::columns(table);
  local_1f8.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_1f8.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_1f8.ptr = (QTextLength *)&DAT_aaaaaaaaaaaaaaaa;
  QTextTableFormat::columnWidthConstraints
            ((QList<QTextLength> *)&local_1f8,(QTextTableFormat *)local_168);
  if ((undefined1 *)local_1f8.size == (undefined1 *)0x0) {
    QList<QTextLength>::resize((QList<QTextLength> *)&local_1f8,(long)(int)uVar5);
    widthEmittedForColumn.super_QVLABase<bool>.super_QVLABaseBase.a._0_4_ = VariableLength;
    widthEmittedForColumn.super_QVLABase<bool>.super_QVLABaseBase.s = 0;
    QList<QTextLength>::fill
              ((QList<QTextLength> *)&local_1f8,(parameter_type)&widthEmittedForColumn,-1);
  }
  memset(&widthEmittedForColumn,0xaa,0x118);
  QVarLengthArray<bool,_256LL>::QVarLengthArray(&widthEmittedForColumn,(long)(int)uVar5);
  uVar9 = 0;
  uVar11 = (ulong)uVar5;
  if ((int)uVar5 < 1) {
    uVar11 = uVar9;
  }
  for (; uVar11 != uVar9; uVar9 = uVar9 + 1) {
    *(undefined1 *)((long)widthEmittedForColumn.super_QVLABase<bool>.super_QVLABaseBase.ptr + uVar9)
         = 0;
  }
  iVar6 = QTextTableFormat::headerRowCount((QTextTableFormat *)local_168);
  if (iVar4 <= iVar6) {
    iVar6 = iVar4;
  }
  if (0 < iVar6) {
    QString::append((QLatin1String *)this);
  }
  rhs = &this->defaultCharFormat;
  col = 0;
  if (iVar4 < 1) {
    iVar4 = 0;
  }
  for (; col != iVar4; col = col + 1) {
    QString::append((QLatin1String *)this);
    local_278 = 0;
    uVar9 = 0;
    while( true ) {
      if (uVar11 == uVar9) break;
      local_178._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_178._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      QTextTable::cellAt((QTextTable *)local_178,(int)table,col);
      iVar7 = QTextTableCell::row((QTextTableCell *)local_178);
      if ((iVar7 == col) &&
         (uVar5 = QTextTableCell::column((QTextTableCell *)local_178), uVar9 == uVar5)) {
        QString::append((QLatin1String *)this);
        if ((*(char *)((long)widthEmittedForColumn.super_QVLABase<bool>.super_QVLABaseBase.ptr +
                      uVar9) == '\0') &&
           (iVar7 = QTextTableCell::columnSpan((QTextTableCell *)local_178), iVar7 == 1)) {
          emitTextLength(this,"width",
                         (QTextLength *)((long)&(local_1f8.ptr)->lengthType + local_278));
          *(undefined1 *)
           ((long)widthEmittedForColumn.super_QVLABase<bool>.super_QVLABaseBase.ptr + uVar9) = 1;
        }
        iVar7 = QTextTableCell::columnSpan((QTextTableCell *)local_178);
        if (1 < iVar7) {
          iVar7 = QTextTableCell::columnSpan((QTextTableCell *)local_178);
          QString::number((int)(QArrayDataPointer<char16_t> *)local_1d8,iVar7);
          emitAttribute(this,"colspan",(QString *)local_1d8);
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_1d8);
        }
        iVar7 = QTextTableCell::rowSpan((QTextTableCell *)local_178);
        if (1 < iVar7) {
          iVar7 = QTextTableCell::rowSpan((QTextTableCell *)local_178);
          QString::number((int)(QArrayDataPointer<char16_t> *)local_1d8,iVar7);
          emitAttribute(this,"rowspan",(QString *)local_1d8);
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_1d8);
        }
        local_188._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_188._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
        QTextTableCell::format((QTextTableCell *)local_1d8);
        QTextFormat::toTableCellFormat((QTextFormat *)local_188);
        QTextFormat::~QTextFormat((QTextFormat *)local_1d8);
        emitBackgroundAttribute(this,(QTextFormat *)local_188);
        local_198._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_198._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
        QTextFormat::QTextFormat((QTextFormat *)local_198,&rhs->super_QTextFormat);
        alignment = QTextCharFormat::verticalAlignment((QTextCharFormat *)local_188);
        local_218.size = 0;
        local_218.d = (Data *)0x0;
        local_218.ptr = (char16_t *)0x0;
        if (alignment - AlignMiddle < 3) {
          QString::append((QLatin1String *)&local_218);
          QString::append((QLatin1String *)&local_218);
          QString::append((QChar)(char16_t)&local_218);
          local_1d8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
          local_1d8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
          QTextCharFormat::QTextCharFormat((QTextCharFormat *)local_1d8);
          QTextCharFormat::setVerticalAlignment((QTextCharFormat *)local_1d8,alignment);
          QTextFormat::merge(&rhs->super_QTextFormat,(QTextFormat *)local_1d8);
          QTextFormat::~QTextFormat((QTextFormat *)local_1d8);
        }
        bVar3 = QTextFormat::hasProperty((QTextFormat *)local_188,0x4814);
        cVar10 = (char)&local_258;
        if (bVar3) {
          qVar2 = QTextTableCellFormat::leftPadding((QTextTableCellFormat *)local_188);
          QString::number(qVar2,cVar10,0x67);
          local_240.b.d.size = local_258.size;
          local_240.b.d.ptr = local_258.ptr;
          local_240.b.d.d = local_258.d;
          local_240.a.m_size = 0xe;
          local_240.a.m_data = " padding-left:";
          local_258.d = (Data *)0x0;
          local_258.ptr = (char16_t *)0x0;
          local_258.size = 0;
          QStringBuilder<QLatin1String,_QString>::QStringBuilder
                    ((QStringBuilder<QLatin1String,_QString> *)local_1d8,&local_240);
          local_1b0 = CONCAT62(local_1b0._2_6_,L';');
          ::operator+=((QString *)&local_218,
                       (QStringBuilder<QStringBuilder<QLatin1String,_QString>,_char16_t> *)local_1d8
                      );
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1c8);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_240.b.d);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_258);
        }
        bVar3 = QTextFormat::hasProperty((QTextFormat *)local_188,0x4815);
        if (bVar3) {
          qVar2 = QTextTableCellFormat::rightPadding((QTextTableCellFormat *)local_188);
          QString::number(qVar2,cVar10,0x67);
          local_240.b.d.size = local_258.size;
          local_240.b.d.ptr = local_258.ptr;
          local_240.b.d.d = local_258.d;
          local_240.a.m_size = 0xf;
          local_240.a.m_data = " padding-right:";
          local_258.d = (Data *)0x0;
          local_258.ptr = (char16_t *)0x0;
          local_258.size = 0;
          QStringBuilder<QLatin1String,_QString>::QStringBuilder
                    ((QStringBuilder<QLatin1String,_QString> *)local_1d8,&local_240);
          local_1b0 = CONCAT62(local_1b0._2_6_,L';');
          ::operator+=((QString *)&local_218,
                       (QStringBuilder<QStringBuilder<QLatin1String,_QString>,_char16_t> *)local_1d8
                      );
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1c8);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_240.b.d);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_258);
        }
        bVar3 = QTextFormat::hasProperty((QTextFormat *)local_188,0x4812);
        if (bVar3) {
          qVar2 = QTextTableCellFormat::topPadding((QTextTableCellFormat *)local_188);
          QString::number(qVar2,cVar10,0x67);
          local_240.b.d.size = local_258.size;
          local_240.b.d.ptr = local_258.ptr;
          local_240.b.d.d = local_258.d;
          local_240.a.m_size = 0xd;
          local_240.a.m_data = " padding-top:";
          local_258.d = (Data *)0x0;
          local_258.ptr = (char16_t *)0x0;
          local_258.size = 0;
          QStringBuilder<QLatin1String,_QString>::QStringBuilder
                    ((QStringBuilder<QLatin1String,_QString> *)local_1d8,&local_240);
          local_1b0 = CONCAT62(local_1b0._2_6_,L';');
          ::operator+=((QString *)&local_218,
                       (QStringBuilder<QStringBuilder<QLatin1String,_QString>,_char16_t> *)local_1d8
                      );
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1c8);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_240.b.d);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_258);
        }
        bVar3 = QTextFormat::hasProperty((QTextFormat *)local_188,0x4813);
        if (bVar3) {
          qVar2 = QTextTableCellFormat::bottomPadding((QTextTableCellFormat *)local_188);
          QString::number(qVar2,cVar10,0x67);
          local_240.b.d.size = local_258.size;
          local_240.b.d.ptr = local_258.ptr;
          local_240.b.d.d = local_258.d;
          local_240.a.m_size = 0x10;
          local_240.a.m_data = " padding-bottom:";
          local_258.d = (Data *)0x0;
          local_258.ptr = (char16_t *)0x0;
          local_258.size = 0;
          QStringBuilder<QLatin1String,_QString>::QStringBuilder
                    ((QStringBuilder<QLatin1String,_QString> *)local_1d8,&local_240);
          local_1b0 = CONCAT62(local_1b0._2_6_,L';');
          ::operator+=((QString *)&local_218,
                       (QStringBuilder<QStringBuilder<QLatin1String,_QString>,_char16_t> *)local_1d8
                      );
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1c8);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_240.b.d);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_258);
        }
        bVar3 = QTextFormat::hasProperty((QTextFormat *)local_188,0x4816);
        if (bVar3) {
          qVar2 = QTextTableCellFormat::topBorder((QTextTableCellFormat *)local_188);
          QString::number(qVar2,cVar10,0x67);
          local_240.b.d.size = local_258.size;
          local_240.b.d.ptr = local_258.ptr;
          local_240.b.d.d = local_258.d;
          local_240.a.m_size = 0xc;
          local_240.a.m_data = " border-top:";
          local_258.d = (Data *)0x0;
          local_258.ptr = (char16_t *)0x0;
          local_258.size = 0;
          QStringBuilder<QLatin1String,_QString>::QStringBuilder
                    ((QStringBuilder<QLatin1String,_QString> *)local_1d8,&local_240);
          local_1b0 = 3;
          local_1a8 = "px;";
          ::operator+=((QString *)&local_218,
                       (QStringBuilder<QStringBuilder<QLatin1String,_QString>,_QLatin1String> *)
                       local_1d8);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1c8);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_240.b.d);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_258);
        }
        bVar3 = QTextFormat::hasProperty((QTextFormat *)local_188,0x4819);
        if (bVar3) {
          qVar2 = QTextTableCellFormat::rightBorder((QTextTableCellFormat *)local_188);
          QString::number(qVar2,cVar10,0x67);
          local_240.b.d.size = local_258.size;
          local_240.b.d.ptr = local_258.ptr;
          local_240.b.d.d = local_258.d;
          local_240.a.m_size = 0xe;
          local_240.a.m_data = " border-right:";
          local_258.d = (Data *)0x0;
          local_258.ptr = (char16_t *)0x0;
          local_258.size = 0;
          QStringBuilder<QLatin1String,_QString>::QStringBuilder
                    ((QStringBuilder<QLatin1String,_QString> *)local_1d8,&local_240);
          local_1b0 = 3;
          local_1a8 = "px;";
          ::operator+=((QString *)&local_218,
                       (QStringBuilder<QStringBuilder<QLatin1String,_QString>,_QLatin1String> *)
                       local_1d8);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1c8);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_240.b.d);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_258);
        }
        bVar3 = QTextFormat::hasProperty((QTextFormat *)local_188,0x4817);
        if (bVar3) {
          qVar2 = QTextTableCellFormat::bottomBorder((QTextTableCellFormat *)local_188);
          QString::number(qVar2,cVar10,0x67);
          local_240.b.d.size = local_258.size;
          local_240.b.d.ptr = local_258.ptr;
          local_240.b.d.d = local_258.d;
          local_240.a.m_size = 0xf;
          local_240.a.m_data = " border-bottom:";
          local_258.d = (Data *)0x0;
          local_258.ptr = (char16_t *)0x0;
          local_258.size = 0;
          QStringBuilder<QLatin1String,_QString>::QStringBuilder
                    ((QStringBuilder<QLatin1String,_QString> *)local_1d8,&local_240);
          local_1b0 = 3;
          local_1a8 = "px;";
          ::operator+=((QString *)&local_218,
                       (QStringBuilder<QStringBuilder<QLatin1String,_QString>,_QLatin1String> *)
                       local_1d8);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1c8);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_240.b.d);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_258);
        }
        bVar3 = QTextFormat::hasProperty((QTextFormat *)local_188,0x4818);
        if (bVar3) {
          qVar2 = QTextTableCellFormat::leftBorder((QTextTableCellFormat *)local_188);
          QString::number(qVar2,cVar10,0x67);
          local_240.b.d.size = local_258.size;
          local_240.b.d.ptr = local_258.ptr;
          local_240.b.d.d = local_258.d;
          local_240.a.m_size = 0xd;
          local_240.a.m_data = " border-left:";
          local_258.d = (Data *)0x0;
          local_258.ptr = (char16_t *)0x0;
          local_258.size = 0;
          QStringBuilder<QLatin1String,_QString>::QStringBuilder
                    ((QStringBuilder<QLatin1String,_QString> *)local_1d8,&local_240);
          local_1b0 = 3;
          local_1a8 = "px;";
          ::operator+=((QString *)&local_218,
                       (QStringBuilder<QStringBuilder<QLatin1String,_QString>,_QLatin1String> *)
                       local_1d8);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1c8);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_240.b.d);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_258);
        }
        bVar3 = QTextFormat::hasProperty((QTextFormat *)local_188,0x481e);
        if (bVar3) {
          QTextTableCellFormat::topBorderBrush((QTextTableCellFormat *)local_260);
          QColor::name((QString *)&local_258,(QColor *)((long)local_260 + 8),HexRgb);
          local_240.b.d.size = local_258.size;
          local_240.b.d.ptr = local_258.ptr;
          local_240.b.d.d = local_258.d;
          local_240.a.m_size = 0x12;
          local_240.a.m_data = " border-top-color:";
          local_258.d = (Data *)0x0;
          local_258.ptr = (char16_t *)0x0;
          local_258.size = 0;
          QStringBuilder<QLatin1String,_QString>::QStringBuilder
                    ((QStringBuilder<QLatin1String,_QString> *)local_1d8,&local_240);
          local_1b0 = CONCAT62(local_1b0._2_6_,L';');
          ::operator+=((QString *)&local_218,
                       (QStringBuilder<QStringBuilder<QLatin1String,_QString>,_char16_t> *)local_1d8
                      );
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1c8);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_240.b.d);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_258);
          QBrush::~QBrush((QBrush *)local_260);
        }
        bVar3 = QTextFormat::hasProperty((QTextFormat *)local_188,0x4821);
        if (bVar3) {
          QTextTableCellFormat::rightBorderBrush((QTextTableCellFormat *)local_260);
          QColor::name((QString *)&local_258,(QColor *)((long)local_260 + 8),HexRgb);
          local_240.b.d.size = local_258.size;
          local_240.b.d.ptr = local_258.ptr;
          local_240.b.d.d = local_258.d;
          local_240.a.m_size = 0x14;
          local_240.a.m_data = " border-right-color:";
          local_258.d = (Data *)0x0;
          local_258.ptr = (char16_t *)0x0;
          local_258.size = 0;
          QStringBuilder<QLatin1String,_QString>::QStringBuilder
                    ((QStringBuilder<QLatin1String,_QString> *)local_1d8,&local_240);
          local_1b0 = CONCAT62(local_1b0._2_6_,L';');
          ::operator+=((QString *)&local_218,
                       (QStringBuilder<QStringBuilder<QLatin1String,_QString>,_char16_t> *)local_1d8
                      );
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1c8);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_240.b.d);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_258);
          QBrush::~QBrush((QBrush *)local_260);
        }
        bVar3 = QTextFormat::hasProperty((QTextFormat *)local_188,0x481f);
        if (bVar3) {
          QTextTableCellFormat::bottomBorderBrush((QTextTableCellFormat *)local_260);
          QColor::name((QString *)&local_258,(QColor *)((long)local_260 + 8),HexRgb);
          local_240.b.d.size = local_258.size;
          local_240.b.d.ptr = local_258.ptr;
          local_240.b.d.d = local_258.d;
          local_240.a.m_size = 0x15;
          local_240.a.m_data = " border-bottom-color:";
          local_258.d = (Data *)0x0;
          local_258.ptr = (char16_t *)0x0;
          local_258.size = 0;
          QStringBuilder<QLatin1String,_QString>::QStringBuilder
                    ((QStringBuilder<QLatin1String,_QString> *)local_1d8,&local_240);
          local_1b0 = CONCAT62(local_1b0._2_6_,L';');
          ::operator+=((QString *)&local_218,
                       (QStringBuilder<QStringBuilder<QLatin1String,_QString>,_char16_t> *)local_1d8
                      );
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1c8);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_240.b.d);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_258);
          QBrush::~QBrush((QBrush *)local_260);
        }
        bVar3 = QTextFormat::hasProperty((QTextFormat *)local_188,0x4820);
        if (bVar3) {
          QTextTableCellFormat::leftBorderBrush((QTextTableCellFormat *)local_260);
          QColor::name((QString *)&local_258,(QColor *)((long)local_260 + 8),HexRgb);
          local_240.b.d.size = local_258.size;
          local_240.b.d.ptr = local_258.ptr;
          local_240.b.d.d = local_258.d;
          local_240.a.m_size = 0x13;
          local_240.a.m_data = " border-left-color:";
          local_258.d = (Data *)0x0;
          local_258.ptr = (char16_t *)0x0;
          local_258.size = 0;
          QStringBuilder<QLatin1String,_QString>::QStringBuilder
                    ((QStringBuilder<QLatin1String,_QString> *)local_1d8,&local_240);
          local_1b0 = CONCAT62(local_1b0._2_6_,L';');
          ::operator+=((QString *)&local_218,
                       (QStringBuilder<QStringBuilder<QLatin1String,_QString>,_char16_t> *)local_1d8
                      );
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1c8);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_240.b.d);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_258);
          QBrush::~QBrush((QBrush *)local_260);
        }
        bVar3 = QTextFormat::hasProperty((QTextFormat *)local_188,0x481a);
        if (bVar3) {
          BVar8 = QTextTableCellFormat::topBorderStyle((QTextTableCellFormat *)local_188);
          local_1c8._0_16_ = richtextBorderStyleToHtmlBorderStyle(BVar8);
          local_1d8._0_8_ = (QTextFormatPrivate *)0x12;
          local_1d8._8_8_ = " border-top-style:";
          local_1c8.size._0_2_ = L';';
          ::operator+=((QString *)&local_218,
                       (QStringBuilder<QStringBuilder<QLatin1String,_QLatin1String>,_char16_t> *)
                       local_1d8);
        }
        bVar3 = QTextFormat::hasProperty((QTextFormat *)local_188,0x481d);
        if (bVar3) {
          BVar8 = QTextTableCellFormat::rightBorderStyle((QTextTableCellFormat *)local_188);
          local_1c8._0_16_ = richtextBorderStyleToHtmlBorderStyle(BVar8);
          local_1d8._0_8_ = (QTextFormatPrivate *)0x14;
          local_1d8._8_8_ = " border-right-style:";
          local_1c8.size._0_2_ = L';';
          ::operator+=((QString *)&local_218,
                       (QStringBuilder<QStringBuilder<QLatin1String,_QLatin1String>,_char16_t> *)
                       local_1d8);
        }
        bVar3 = QTextFormat::hasProperty((QTextFormat *)local_188,0x481b);
        if (bVar3) {
          BVar8 = QTextTableCellFormat::bottomBorderStyle((QTextTableCellFormat *)local_188);
          local_1c8._0_16_ = richtextBorderStyleToHtmlBorderStyle(BVar8);
          local_1d8._0_8_ = (QTextFormatPrivate *)0x15;
          local_1d8._8_8_ = " border-bottom-style:";
          local_1c8.size._0_2_ = L';';
          ::operator+=((QString *)&local_218,
                       (QStringBuilder<QStringBuilder<QLatin1String,_QLatin1String>,_char16_t> *)
                       local_1d8);
        }
        bVar3 = QTextFormat::hasProperty((QTextFormat *)local_188,0x481c);
        if (bVar3) {
          BVar8 = QTextTableCellFormat::leftBorderStyle((QTextTableCellFormat *)local_188);
          local_1c8._0_16_ = richtextBorderStyleToHtmlBorderStyle(BVar8);
          local_1d8._0_8_ = (QTextFormatPrivate *)0x13;
          local_1d8._8_8_ = " border-left-style:";
          local_1c8.size._0_2_ = L';';
          ::operator+=((QString *)&local_218,
                       (QStringBuilder<QStringBuilder<QLatin1String,_QLatin1String>,_char16_t> *)
                       local_1d8);
        }
        if (local_218.size != 0) {
          local_1d8._0_8_ = &DAT_00000008;
          local_1d8._8_8_ = " style=\"";
          local_1c8.ptr._0_2_ = 0x22;
          local_1c8.d = (Data *)&local_218;
          ::operator+=(&this->html,
                       (QStringBuilder<QStringBuilder<QLatin1String,_QString_&>,_char16_t> *)
                       local_1d8);
        }
        QString::append((QChar)(char16_t)this);
        QTextTableCell::begin((iterator *)local_1d8,(QTextTableCell *)local_178);
        emitFrame(this,(iterator *)local_1d8);
        QString::append((QLatin1String *)this);
        QTextFormat::operator=(&rhs->super_QTextFormat,(QTextFormat *)local_198);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_218);
        QTextFormat::~QTextFormat((QTextFormat *)local_198);
        QTextFormat::~QTextFormat((QTextFormat *)local_188);
      }
      uVar9 = uVar9 + 1;
      local_278 = local_278 + 0x10;
    }
    QString::append((QLatin1String *)this);
    if (0 < iVar6 && col == iVar6 + -1) {
      QString::append((QLatin1String *)this);
    }
  }
  QString::append((QLatin1String *)this);
  QVarLengthArray<bool,_256LL>::~QVarLengthArray(&widthEmittedForColumn);
  QArrayDataPointer<QTextLength>::~QArrayDataPointer(&local_1f8);
  QTextFormat::~QTextFormat((QTextFormat *)local_168);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTextHtmlExporter::emitTable(const QTextTable *table)
{
    QTextTableFormat format = table->format();

    html += "\n<table"_L1;

    if (format.hasProperty(QTextFormat::FrameBorder))
        emitAttribute("border", QString::number(format.border()));

    emitFrameStyle(format, TableFrame);

    emitAlignment(format.alignment());
    emitTextLength("width", format.width());

    if (format.hasProperty(QTextFormat::TableCellSpacing))
        emitAttribute("cellspacing", QString::number(format.cellSpacing()));
    if (format.hasProperty(QTextFormat::TableCellPadding))
        emitAttribute("cellpadding", QString::number(format.cellPadding()));

    emitBackgroundAttribute(format);

    html += u'>';

    const int rows = table->rows();
    const int columns = table->columns();

    QList<QTextLength> columnWidths = format.columnWidthConstraints();
    if (columnWidths.isEmpty()) {
        columnWidths.resize(columns);
        columnWidths.fill(QTextLength());
    }
    Q_ASSERT(columnWidths.size() == columns);

    QVarLengthArray<bool> widthEmittedForColumn(columns);
    for (int i = 0; i < columns; ++i)
        widthEmittedForColumn[i] = false;

    const int headerRowCount = qMin(format.headerRowCount(), rows);
    if (headerRowCount > 0)
        html += "<thead>"_L1;

    for (int row = 0; row < rows; ++row) {
        html += "\n<tr>"_L1;

        for (int col = 0; col < columns; ++col) {
            const QTextTableCell cell = table->cellAt(row, col);

            // for col/rowspans
            if (cell.row() != row)
                continue;

            if (cell.column() != col)
                continue;

            html += "\n<td"_L1;

            if (!widthEmittedForColumn[col] && cell.columnSpan() == 1) {
                emitTextLength("width", columnWidths.at(col));
                widthEmittedForColumn[col] = true;
            }

            if (cell.columnSpan() > 1)
                emitAttribute("colspan", QString::number(cell.columnSpan()));

            if (cell.rowSpan() > 1)
                emitAttribute("rowspan", QString::number(cell.rowSpan()));

            const QTextTableCellFormat cellFormat = cell.format().toTableCellFormat();
            emitBackgroundAttribute(cellFormat);

            QTextCharFormat oldDefaultCharFormat = defaultCharFormat;

            QTextCharFormat::VerticalAlignment valign = cellFormat.verticalAlignment();

            QString styleString;
            if (valign >= QTextCharFormat::AlignMiddle && valign <= QTextCharFormat::AlignBottom) {
                styleString += " vertical-align:"_L1;
                switch (valign) {
                case QTextCharFormat::AlignMiddle:
                    styleString += "middle"_L1;
                    break;
                case QTextCharFormat::AlignTop:
                    styleString += "top"_L1;
                    break;
                case QTextCharFormat::AlignBottom:
                    styleString += "bottom"_L1;
                    break;
                default:
                    break;
                }
                styleString += u';';

                QTextCharFormat temp;
                temp.setVerticalAlignment(valign);
                defaultCharFormat.merge(temp);
            }

            if (cellFormat.hasProperty(QTextFormat::TableCellLeftPadding))
                styleString += " padding-left:"_L1 + QString::number(cellFormat.leftPadding()) + u';';
            if (cellFormat.hasProperty(QTextFormat::TableCellRightPadding))
                styleString += " padding-right:"_L1 + QString::number(cellFormat.rightPadding()) + u';';
            if (cellFormat.hasProperty(QTextFormat::TableCellTopPadding))
                styleString += " padding-top:"_L1 + QString::number(cellFormat.topPadding()) + u';';
            if (cellFormat.hasProperty(QTextFormat::TableCellBottomPadding))
                styleString += " padding-bottom:"_L1 + QString::number(cellFormat.bottomPadding()) + u';';

            if (cellFormat.hasProperty(QTextFormat::TableCellTopBorder))
                styleString += " border-top:"_L1 + QString::number(cellFormat.topBorder()) + "px;"_L1;
            if (cellFormat.hasProperty(QTextFormat::TableCellRightBorder))
                styleString += " border-right:"_L1 + QString::number(cellFormat.rightBorder()) + "px;"_L1;
            if (cellFormat.hasProperty(QTextFormat::TableCellBottomBorder))
                styleString += " border-bottom:"_L1 + QString::number(cellFormat.bottomBorder()) + "px;"_L1;
            if (cellFormat.hasProperty(QTextFormat::TableCellLeftBorder))
                styleString += " border-left:"_L1 + QString::number(cellFormat.leftBorder()) + "px;"_L1;

            if (cellFormat.hasProperty(QTextFormat::TableCellTopBorderBrush))
                styleString += " border-top-color:"_L1 + cellFormat.topBorderBrush().color().name() + u';';
            if (cellFormat.hasProperty(QTextFormat::TableCellRightBorderBrush))
                styleString += " border-right-color:"_L1 + cellFormat.rightBorderBrush().color().name() + u';';
            if (cellFormat.hasProperty(QTextFormat::TableCellBottomBorderBrush))
                styleString += " border-bottom-color:"_L1 + cellFormat.bottomBorderBrush().color().name() + u';';
            if (cellFormat.hasProperty(QTextFormat::TableCellLeftBorderBrush))
                styleString += " border-left-color:"_L1 + cellFormat.leftBorderBrush().color().name() + u';';

            if (cellFormat.hasProperty(QTextFormat::TableCellTopBorderStyle))
                styleString += " border-top-style:"_L1 + richtextBorderStyleToHtmlBorderStyle(cellFormat.topBorderStyle()) + u';';
            if (cellFormat.hasProperty(QTextFormat::TableCellRightBorderStyle))
                styleString += " border-right-style:"_L1 + richtextBorderStyleToHtmlBorderStyle(cellFormat.rightBorderStyle()) + u';';
            if (cellFormat.hasProperty(QTextFormat::TableCellBottomBorderStyle))
                styleString += " border-bottom-style:"_L1 + richtextBorderStyleToHtmlBorderStyle(cellFormat.bottomBorderStyle()) + u';';
            if (cellFormat.hasProperty(QTextFormat::TableCellLeftBorderStyle))
                styleString += " border-left-style:"_L1 + richtextBorderStyleToHtmlBorderStyle(cellFormat.leftBorderStyle()) + u';';

            if (!styleString.isEmpty())
                html += " style=\""_L1 + styleString + u'\"';

            html += u'>';

            emitFrame(cell.begin());

            html += "</td>"_L1;

            defaultCharFormat = oldDefaultCharFormat;
        }

        html += "</tr>"_L1;
        if (headerRowCount > 0 && row == headerRowCount - 1)
            html += "</thead>"_L1;
    }

    html += "</table>"_L1;
}